

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncTimeCoordinator.cpp
# Opt level: O3

MessageProcessingResult __thiscall
helics::AsyncTimeCoordinator::checkExecEntry(AsyncTimeCoordinator *this,GlobalFederateId param_1)

{
  ActionMessage execgrant;
  ActionMessage AStack_c8;
  
  (this->super_BaseTimeCoordinator).executionMode = true;
  (this->currentMinTime).internalTimeCode = 0;
  this->currentTimeState = time_granted;
  (this->nextEvent).internalTimeCode = 0;
  ActionMessage::ActionMessage(&AStack_c8,cmd_exec_grant);
  AStack_c8.source_id.gid = (this->super_BaseTimeCoordinator).mSourceId.gid;
  transmitTimingMessagesDownstream(this,&AStack_c8,(GlobalFederateId)0x8831d580);
  transmitTimingMessagesUpstream(this,&AStack_c8);
  ActionMessage::~ActionMessage(&AStack_c8);
  return NEXT_STEP;
}

Assistant:

MessageProcessingResult AsyncTimeCoordinator::checkExecEntry(GlobalFederateId /*triggerFed*/)
{
    auto ret = MessageProcessingResult::CONTINUE_PROCESSING;

    executionMode = true;
    ret = MessageProcessingResult::NEXT_STEP;

    currentMinTime = timeZero;
    currentTimeState = TimeState::time_granted;
    nextEvent = timeZero;

    ActionMessage execgrant(CMD_EXEC_GRANT);
    execgrant.source_id = mSourceId;
    transmitTimingMessagesDownstream(execgrant);
    transmitTimingMessagesUpstream(execgrant);
    return ret;
}